

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

UBool __thiscall icu_63::PluralRules::operator==(PluralRules *this,PluralRules *other)

{
  UBool UVar1;
  uint in_EAX;
  int iVar2;
  int iVar3;
  StringEnumeration *pSVar4;
  StringEnumeration *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar6;
  UErrorCode status;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (this == other) {
    return '\x01';
  }
  pSVar4 = getKeywords(this,(UErrorCode *)((long)&uStack_38 + 4));
  pSVar5 = getKeywords(other,(UErrorCode *)((long)&uStack_38 + 4));
  if (uStack_38._4_4_ < 1) {
    iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[4])(pSVar4,(long)&uStack_38 + 4);
    iVar3 = (*(pSVar5->super_UObject)._vptr_UObject[4])(pSVar5,(long)&uStack_38 + 4);
    if (iVar2 == iVar3) {
      (*(pSVar4->super_UObject)._vptr_UObject[8])(pSVar4,(long)&uStack_38 + 4);
      do {
        iVar2 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4,(long)&uStack_38 + 4);
        if ((UnicodeString *)CONCAT44(extraout_var,iVar2) == (UnicodeString *)0x0) {
          (*(pSVar5->super_UObject)._vptr_UObject[8])(pSVar5,(long)&uStack_38 + 4);
          goto LAB_00275de2;
        }
        UVar1 = isKeyword(other,(UnicodeString *)CONCAT44(extraout_var,iVar2));
      } while (UVar1 != '\0');
    }
  }
  goto LAB_00275e02;
  while (UVar1 = isKeyword(this,(UnicodeString *)CONCAT44(extraout_var_00,iVar2)), UVar1 != '\0') {
LAB_00275de2:
    iVar2 = (*(pSVar5->super_UObject)._vptr_UObject[7])(pSVar5,(long)&uStack_38 + 4);
    if ((UnicodeString *)CONCAT44(extraout_var_00,iVar2) == (UnicodeString *)0x0) {
      bVar6 = uStack_38._4_4_ < 1;
      goto LAB_00275e04;
    }
  }
LAB_00275e02:
  bVar6 = false;
LAB_00275e04:
  if (pSVar5 != (StringEnumeration *)0x0) {
    (*(pSVar5->super_UObject)._vptr_UObject[1])(pSVar5);
  }
  if (pSVar4 != (StringEnumeration *)0x0) {
    (*(pSVar4->super_UObject)._vptr_UObject[1])(pSVar4);
  }
  return bVar6;
}

Assistant:

UBool
PluralRules::operator==(const PluralRules& other) const  {
    const UnicodeString *ptrKeyword;
    UErrorCode status= U_ZERO_ERROR;

    if ( this == &other ) {
        return TRUE;
    }
    LocalPointer<StringEnumeration> myKeywordList(getKeywords(status));
    LocalPointer<StringEnumeration> otherKeywordList(other.getKeywords(status));
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (myKeywordList->count(status)!=otherKeywordList->count(status)) {
        return FALSE;
    }
    myKeywordList->reset(status);
    while ((ptrKeyword=myKeywordList->snext(status))!=nullptr) {
        if (!other.isKeyword(*ptrKeyword)) {
            return FALSE;
        }
    }
    otherKeywordList->reset(status);
    while ((ptrKeyword=otherKeywordList->snext(status))!=nullptr) {
        if (!this->isKeyword(*ptrKeyword)) {
            return FALSE;
        }
    }
    if (U_FAILURE(status)) {
        return FALSE;
    }

    return TRUE;
}